

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O3

UGroup * duckdb_re2::MaybeParsePerlCCEscape(StringPiece *s,ParseFlags parse_flags)

{
  ulong uVar1;
  duckdb_re2 *this;
  UGroup *pUVar2;
  
  if (-1 < (char)parse_flags) {
    return (UGroup *)0x0;
  }
  uVar1 = s->size_;
  if (((1 < uVar1) && (this = (duckdb_re2 *)s->data_, *this == (duckdb_re2)0x5c)) &&
     (pUVar2 = LookupGroup(this,(StringPiece *)0x2,(UGroup *)perl_groups,6), pUVar2 != (UGroup *)0x0
     )) {
    s->data_ = (const_pointer)(this + 2);
    s->size_ = uVar1 - 2;
    return pUVar2;
  }
  return (UGroup *)0x0;
}

Assistant:

const UGroup* MaybeParsePerlCCEscape(StringPiece* s, Regexp::ParseFlags parse_flags) {
  if (!(parse_flags & Regexp::PerlClasses))
    return NULL;
  if (s->size() < 2 || (*s)[0] != '\\')
    return NULL;
  // Could use StringPieceToRune, but there aren't
  // any non-ASCII Perl group names.
  StringPiece name(s->data(), 2);
  const UGroup *g = LookupPerlGroup(name);
  if (g == NULL)
    return NULL;
  s->remove_prefix(name.size());
  return g;
}